

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool google::protobuf::compiler::anon_unknown_5::ContainsProto3Optional
               (Edition edition,FileDescriptor *file)

{
  bool bVar1;
  int iVar2;
  Descriptor *desc;
  int local_1c;
  int i;
  FileDescriptor *file_local;
  Edition edition_local;
  
  if (edition == EDITION_PROTO3) {
    for (local_1c = 0; iVar2 = FileDescriptor::message_type_count(file), local_1c < iVar2;
        local_1c = local_1c + 1) {
      desc = FileDescriptor::message_type(file,local_1c);
      bVar1 = ContainsProto3Optional(desc);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ContainsProto3Optional(Edition edition, const FileDescriptor* file) {
  if (edition == Edition::EDITION_PROTO3) {
    for (int i = 0; i < file->message_type_count(); ++i) {
      if (ContainsProto3Optional(file->message_type(i))) {
        return true;
      }
    }
  }
  return false;
}